

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CB3DMeshFileLoader.cpp
# Opt level: O3

bool __thiscall
irr::scene::CB3DMeshFileLoader::readChunkBONE(CB3DMeshFileLoader *this,SJoint *inJoint)

{
  long lVar1;
  pointer piVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong in_RAX;
  undefined4 extraout_var;
  undefined2 *puVar6;
  undefined4 extraout_var_00;
  ulong uVar7;
  void *pvVar8;
  void *__src;
  long lVar9;
  double __x;
  double __x_00;
  u32 globalVertexID;
  f32 strength;
  undefined8 local_38;
  
  lVar1 = *(long *)&(this->super_IMeshLoader).field_0x10;
  lVar9 = (long)*(int *)(lVar1 + -0xc);
  local_38 = in_RAX;
  if ((8 < lVar9) &&
     (lVar1 = *(long *)(lVar1 + -8), iVar3 = (*this->B3DFile->_vptr_IReadFile[3])(),
     CONCAT44(extraout_var,iVar3) < lVar9 + lVar1)) {
    do {
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&local_38,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,(long)&local_38 + 4,4);
      uVar4 = (int)local_38 + this->VerticesStart;
      local_38 = CONCAT44(local_38._4_4_,uVar4);
      piVar2 = (this->AnimatedVertices_VertexID).m_data.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if ((uint)((ulong)((long)(this->AnimatedVertices_VertexID).m_data.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar2) >> 2) <= uVar4) {
        (*this->B3DFile->_vptr_IReadFile[4])();
        os::Printer::log(__x_00);
        return false;
      }
      if (piVar2[uVar4] == -1) {
        os::Printer::log((Printer *)
                         "B3dMeshLoader: Weight has bad vertex id (no link to meshbuffer index found)"
                         ,__x);
      }
      else if (0.0 < local_38._4_4_) {
        puVar6 = (undefined2 *)
                 (**(code **)(*(long *)this->AnimatedMesh + 0x100))(this->AnimatedMesh,inJoint);
        *(float *)(puVar6 + 4) = local_38._4_4_;
        *(int *)(puVar6 + 2) =
             (this->AnimatedVertices_VertexID).m_data.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start[local_38 & 0xffffffff];
        *puVar6 = (short)(this->AnimatedVertices_BufferID).m_data.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[local_38 & 0xffffffff];
      }
      lVar1 = *(long *)&(this->super_IMeshLoader).field_0x10;
      iVar3 = *(int *)(lVar1 + -0xc);
      lVar1 = *(long *)(lVar1 + -8);
      iVar5 = (*this->B3DFile->_vptr_IReadFile[3])();
    } while (CONCAT44(extraout_var_00,iVar5) < iVar3 + lVar1);
  }
  lVar1 = *(long *)&(this->super_IMeshLoader).field_0x8;
  pvVar8 = *(void **)&(this->super_IMeshLoader).field_0x10;
  uVar7 = (long)pvVar8 + (0xffffffff0 - lVar1) & 0xffffffff0;
  __src = (void *)(lVar1 + uVar7 + 0x10);
  if (__src != pvVar8) {
    memmove((void *)(lVar1 + uVar7),__src,(long)pvVar8 - (long)__src);
    pvVar8 = *(void **)&(this->super_IMeshLoader).field_0x10;
  }
  *(long *)&(this->super_IMeshLoader).field_0x10 = (long)pvVar8 + -0x10;
  return true;
}

Assistant:

bool CB3DMeshFileLoader::readChunkBONE(CSkinnedMesh::SJoint *inJoint)
{
#ifdef _B3D_READER_DEBUG
	core::stringc logStr;
	for (u32 i = 1; i < B3dStack.size(); ++i)
		logStr += "-";
	logStr += "read ChunkBONE";
	os::Printer::log(logStr.c_str(), ELL_DEBUG);
#endif

	if (B3dStack.getLast().length > 8) {
		while ((B3dStack.getLast().startposition + B3dStack.getLast().length) > B3DFile->getPos()) // this chunk repeats
		{
			u32 globalVertexID;
			f32 strength;
			B3DFile->read(&globalVertexID, sizeof(globalVertexID));
			B3DFile->read(&strength, sizeof(strength));
#ifdef __BIG_ENDIAN__
			globalVertexID = os::Byteswap::byteswap(globalVertexID);
			strength = os::Byteswap::byteswap(strength);
#endif
			globalVertexID += VerticesStart;

			if (globalVertexID >= AnimatedVertices_VertexID.size()) {
				os::Printer::log("Illegal vertex index found", B3DFile->getFileName(), ELL_ERROR);
				return false;
			}

			if (AnimatedVertices_VertexID[globalVertexID] == -1) {
				os::Printer::log("B3dMeshLoader: Weight has bad vertex id (no link to meshbuffer index found)");
			} else if (strength > 0) {
				CSkinnedMesh::SWeight *weight = AnimatedMesh->addWeight(inJoint);
				weight->strength = strength;
				// Find the meshbuffer and Vertex index from the Global Vertex ID:
				weight->vertex_id = AnimatedVertices_VertexID[globalVertexID];
				weight->buffer_id = AnimatedVertices_BufferID[globalVertexID];
			}
		}
	}

	B3dStack.erase(B3dStack.size() - 1);
	return true;
}